

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O2

UINT8 CompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmprInfo)

{
  UINT8 UVar1;
  UINT16 srcLen;
  PCM_COMPR_TBL *pPVar2;
  byte bVar3;
  UINT32 dstLen;
  ushort uVar4;
  short sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  ushort uVar14;
  ushort uVar15;
  int iVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  UINT8 *pUVar27;
  ushort *puVar28;
  byte *pbVar29;
  UINT16 *local_48;
  
  if (cmprInfo->comprType != '\0') {
    return 0x80;
  }
  uVar7 = (ulong)outLen;
  bVar12 = cmprInfo->bitsDec;
  uVar11 = bVar12 + 7 >> 3;
  if (uVar11 == 2) {
    lVar22 = 1L << (bVar12 & 0x3f);
    bVar13 = cmprInfo->bitsCmp;
    uVar4 = (ushort)bVar13;
    UVar1 = cmprInfo->subType;
    if (UVar1 == '\x02') {
      pPVar2 = cmprInfo->comprTbl;
      uVar15 = pPVar2->valueCount;
      if (uVar15 == 0) {
        return '\x10';
      }
      if (bVar12 != pPVar2->bitsDec) {
        return '\x11';
      }
      if (bVar13 != pPVar2->bitsCmp) {
        return '\x11';
      }
      dstLen = (UINT32)lVar22;
      local_48 = (UINT16 *)malloc(lVar22 * 2);
      GenerateReverseLUT_16(dstLen,local_48,(uint)uVar15,(pPVar2->values).d16);
      uVar15 = 0;
      uVar11 = (uint)((uVar7 << 4) / (ulong)bVar13);
      if (uVar11 < inLen) {
        inLen = uVar11;
      }
      puVar28 = (ushort *)(inData + inLen);
      for (; inData < puVar28; inData = (UINT8 *)((long)inData + 2)) {
        bVar12 = (byte)(-0x100 >> ((byte)uVar15 & 0x1f)) & *outData;
        uVar11 = (uint)bVar12;
        uVar10 = local_48[(uint)*(ushort *)inData & dstLen + 0xffff];
        *outData = bVar12;
        sVar5 = 0;
        for (uVar14 = uVar4; uVar14 != 0; uVar14 = uVar14 - uVar9) {
          uVar9 = 8;
          if (uVar14 < 8) {
            uVar9 = uVar14;
          }
          uVar15 = uVar15 + uVar9;
          uVar18 = ((uint)(uVar10 >> ((byte)sVar5 & 0x1f)) & ~(-1 << ((byte)uVar9 & 0x1f))) << 8;
          bVar12 = (byte)uVar11 | (byte)(uVar18 >> ((byte)uVar15 & 0x1f));
          uVar11 = (uint)bVar12;
          *outData = bVar12;
          if (7 < uVar15) {
            uVar15 = uVar15 - 8;
            uVar11 = uVar18 >> ((byte)uVar15 & 0x1f);
            outData[1] = (byte)uVar11;
            outData = outData + 1;
          }
          sVar5 = sVar5 + uVar9;
        }
      }
    }
    else {
      uVar15 = cmprInfo->baseVal;
      local_48 = (UINT16 *)0x0;
      uVar11 = (uint)((uVar7 << 4) / (ulong)bVar13);
      if (uVar11 < inLen) {
        inLen = uVar11;
      }
      puVar28 = (ushort *)(inData + inLen);
      if (UVar1 == '\x01') {
        local_48 = (UINT16 *)0x0;
        uVar10 = 0;
        for (; inData < puVar28; inData = (UINT8 *)((long)inData + 2)) {
          uVar14 = *(ushort *)inData;
          bVar24 = (byte)(-0x100 >> ((byte)uVar10 & 0x1f)) & *outData;
          uVar11 = (uint)bVar24;
          *outData = bVar24;
          sVar5 = 0;
          for (uVar9 = uVar4; uVar9 != 0; uVar9 = uVar9 - uVar17) {
            uVar17 = 8;
            if (uVar9 < 8) {
              uVar17 = uVar9;
            }
            uVar10 = uVar10 + uVar17;
            uVar18 = (((uint)uVar14 - (uint)uVar15 >> (bVar12 - bVar13 & 0x1f)) >>
                      ((byte)sVar5 & 0x1f) & 0xffff & ~(-1 << ((byte)uVar17 & 0x1f))) << 8;
            bVar24 = (byte)uVar11 | (byte)(uVar18 >> ((byte)uVar10 & 0x1f));
            uVar11 = (uint)bVar24;
            *outData = bVar24;
            if (7 < uVar10) {
              uVar10 = uVar10 - 8;
              uVar11 = uVar18 >> ((byte)uVar10 & 0x1f);
              outData[1] = (byte)uVar11;
              outData = outData + 1;
            }
            sVar5 = sVar5 + uVar17;
          }
        }
      }
      else if (UVar1 == '\0') {
        local_48 = (UINT16 *)0x0;
        uVar10 = 0;
        for (; inData < puVar28; inData = (UINT8 *)((long)inData + 2)) {
          uVar14 = *(ushort *)inData;
          bVar12 = (byte)(-0x100 >> ((byte)uVar10 & 0x1f)) & *outData;
          uVar11 = (uint)bVar12;
          *outData = bVar12;
          sVar5 = 0;
          for (uVar9 = uVar4; uVar9 != 0; uVar9 = uVar9 - uVar17) {
            uVar17 = 8;
            if (uVar9 < 8) {
              uVar17 = uVar9;
            }
            uVar10 = uVar10 + uVar17;
            uVar18 = ((uint)uVar14 - (uint)uVar15 >> ((byte)sVar5 & 0x1f) & 0xffff &
                     ~(-1 << ((byte)uVar17 & 0x1f))) << 8;
            bVar12 = (byte)uVar11 | (byte)(uVar18 >> ((byte)uVar10 & 0x1f));
            uVar11 = (uint)bVar12;
            *outData = bVar12;
            if (7 < uVar10) {
              uVar10 = uVar10 - 8;
              uVar11 = uVar18 >> ((byte)uVar10 & 0x1f);
              outData[1] = (byte)uVar11;
              outData = outData + 1;
            }
            sVar5 = sVar5 + uVar17;
          }
        }
      }
    }
  }
  else {
    if (uVar11 != 1) {
      return ' ';
    }
    uVar21 = 1L << (bVar12 & 0x3f);
    bVar13 = cmprInfo->bitsCmp;
    uVar11 = (uint)bVar13;
    UVar1 = cmprInfo->subType;
    if (UVar1 == '\x02') {
      pPVar2 = cmprInfo->comprTbl;
      srcLen = pPVar2->valueCount;
      if (srcLen == 0) {
        return '\x10';
      }
      if (bVar12 != pPVar2->bitsDec) {
        return '\x11';
      }
      if (bVar13 != pPVar2->bitsCmp) {
        return '\x11';
      }
      local_48 = (UINT16 *)malloc(uVar21 & 0xffff);
      GenerateReverseLUT_8((UINT16)uVar21,(UINT8 *)local_48,srcLen,(pPVar2->values).d8);
      iVar16 = 0;
      uVar18 = (uint)((uVar7 << 3) / (ulong)bVar13);
      if (uVar18 < inLen) {
        inLen = uVar18;
      }
      pUVar27 = inData + inLen;
      for (; inData < pUVar27; inData = inData + 1) {
        uVar21 = (ulong)cmprInfo->comprTbl->valueCount;
        for (uVar7 = 0;
            (uVar8 = uVar21, uVar21 != uVar7 &&
            (uVar8 = uVar7, *inData != (cmprInfo->comprTbl->values).d8[uVar7])); uVar7 = uVar7 + 1)
        {
        }
        bVar12 = (byte)(-0x100 >> ((byte)iVar16 & 0x1f)) & *outData;
        uVar20 = (uint)bVar12;
        *outData = bVar12;
        uVar6 = 0;
        for (uVar18 = uVar11; (ushort)uVar18 != 0; uVar18 = uVar18 - uVar26) {
          uVar26 = 8;
          if ((ushort)uVar18 < 8) {
            uVar26 = uVar18;
          }
          iVar16 = iVar16 + uVar26;
          uVar19 = (((uint)uVar8 & 0xffff) >> ((byte)uVar6 & 0x1f) & ~(-1 << ((byte)uVar26 & 0x1f)))
                   << 8;
          bVar12 = (byte)uVar20 | (byte)(uVar19 >> ((byte)iVar16 & 0x1f));
          uVar20 = (uint)bVar12;
          *outData = bVar12;
          if (7 < (ushort)iVar16) {
            iVar16 = iVar16 + -8;
            uVar20 = uVar19 >> ((byte)iVar16 & 0x1f);
            outData[1] = (byte)uVar20;
            outData = outData + 1;
          }
          uVar6 = (uVar6 & 0xffff) + (uVar26 & 0xffff);
        }
      }
    }
    else {
      uVar18 = (uint)(byte)cmprInfo->baseVal;
      local_48 = (UINT16 *)0x0;
      uVar6 = (uint)((uVar7 << 3) / (ulong)bVar13);
      if (uVar6 < inLen) {
        inLen = uVar6;
      }
      pbVar29 = inData + inLen;
      if (UVar1 == '\x01') {
        local_48 = (UINT16 *)0x0;
        iVar16 = 0;
        for (; inData < pbVar29; inData = inData + 1) {
          bVar24 = *inData;
          bVar3 = bVar12 - bVar13 & 0x1f;
          bVar23 = (byte)(-0x100 >> ((byte)iVar16 & 0x1f)) & *outData;
          uVar20 = (uint)bVar23;
          *outData = bVar23;
          uVar26 = 0 >> bVar3;
          for (uVar6 = uVar11; (ushort)uVar6 != 0; uVar6 = uVar6 - uVar19) {
            uVar19 = 8;
            if ((ushort)uVar6 < 8) {
              uVar19 = uVar6;
            }
            iVar16 = iVar16 + uVar19;
            uVar25 = (((int)(bVar24 - uVar18) >> bVar3 & 0xffffU) >> ((byte)uVar26 & 0x1f) &
                     ~(-1 << ((byte)uVar19 & 0x1f))) << 8;
            bVar23 = (byte)uVar20 | (byte)(uVar25 >> ((byte)iVar16 & 0x1f));
            uVar20 = (uint)bVar23;
            *outData = bVar23;
            if (7 < (ushort)iVar16) {
              iVar16 = iVar16 + -8;
              uVar20 = uVar25 >> ((byte)iVar16 & 0x1f);
              outData[1] = (byte)uVar20;
              outData = outData + 1;
            }
            uVar26 = (uVar26 & 0xffff) + (uVar19 & 0xffff);
          }
        }
      }
      else if (UVar1 == '\0') {
        local_48 = (UINT16 *)0x0;
        iVar16 = 0;
        for (; inData < pbVar29; inData = inData + 1) {
          bVar12 = *inData;
          bVar13 = (byte)(-0x100 >> ((byte)iVar16 & 0x1f)) & *outData;
          uVar26 = (uint)bVar13;
          *outData = bVar13;
          uVar20 = 0;
          for (uVar6 = uVar11; (ushort)uVar6 != 0; uVar6 = uVar6 - uVar19) {
            uVar19 = 8;
            if ((ushort)uVar6 < 8) {
              uVar19 = uVar6;
            }
            iVar16 = iVar16 + uVar19;
            uVar25 = ((bVar12 - uVar18 & 0xffff) >> ((byte)uVar20 & 0x1f) &
                     ~(-1 << ((byte)uVar19 & 0x1f))) << 8;
            bVar13 = (byte)uVar26 | (byte)(uVar25 >> ((byte)iVar16 & 0x1f));
            uVar26 = (uint)bVar13;
            *outData = bVar13;
            if (7 < (ushort)iVar16) {
              iVar16 = iVar16 + -8;
              uVar26 = uVar25 >> ((byte)iVar16 & 0x1f);
              outData[1] = (byte)uVar26;
              outData = outData + 1;
            }
            uVar20 = (uVar20 & 0xffff) + (uVar19 & 0xffff);
          }
        }
      }
    }
  }
  free(local_48);
  return '\0';
}

Assistant:

UINT8 CompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Compress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Compress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}